

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void empty_readdir_cb(uv_fs_t *req)

{
  void *dir;
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  undefined8 uStack_10;
  
  dir = readdir_req.ptr;
  if (req == &readdir_req) {
    if (readdir_req.fs_type == UV_FS_READDIR) {
      if (readdir_req.result == 0) {
        uv_fs_req_cleanup(&readdir_req);
        loop = uv_default_loop();
        iVar1 = uv_fs_closedir(loop,&closedir_req,(uv_dir_t *)dir,empty_closedir_cb);
        if (iVar1 == 0) {
          return;
        }
        pcVar2 = "r == 0";
        uStack_10 = 0x46;
      }
      else {
        pcVar2 = "req->result == 0";
        uStack_10 = 0x3f;
      }
    }
    else {
      pcVar2 = "req->fs_type == UV_FS_READDIR";
      uStack_10 = 0x3e;
    }
  }
  else {
    pcVar2 = "req == &readdir_req";
    uStack_10 = 0x3d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &readdir_req);
  ASSERT(req->fs_type == UV_FS_READDIR);
  ASSERT(req->result == 0);
  dir = req->ptr;
  uv_fs_req_cleanup(req);
  r = uv_fs_closedir(uv_default_loop(),
                     &closedir_req,
                     dir,
                     empty_closedir_cb);
  ASSERT(r == 0);
}